

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithiutil.cpp
# Opt level: O0

FILE * ithi_file_open_ex(char *file_name,char *flags,int *last_err)

{
  FILE *pFVar1;
  int *piVar2;
  FILE *F;
  int *last_err_local;
  char *flags_local;
  char *file_name_local;
  
  pFVar1 = fopen(file_name,flags);
  if ((pFVar1 == (FILE *)0x0) && (last_err != (int *)0x0)) {
    piVar2 = __errno_location();
    *last_err = *piVar2;
  }
  return (FILE *)pFVar1;
}

Assistant:

FILE* ithi_file_open_ex(char const* file_name, char const* flags, int* last_err)
{
    FILE* F;

#ifdef _WINDOWS
    errno_t err = fopen_s(&F, file_name, flags);
    if (err != 0) {
        if (last_err != NULL) {
            *last_err = err;
        }
        if (F != NULL) {
            fclose(F);
            F = NULL;
        }
    }
#else
    F = fopen(file_name, flags);
    if (F == NULL && last_err != NULL) {
        *last_err = errno;
    }
#endif

    return F;
}